

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressSequences_internal
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,void *dst,
                 size_t dstCapacity,U32 *workspace,int bmi2)

{
  uint uVar1;
  symbolEncodingType_e sVar2;
  ZSTD_defaultPolicy_e isDefaultAllowed;
  symbolEncodingType_e defaultMax;
  symbolEncodingType_e sVar3;
  void *workspace_00;
  size_t prevCTableSize;
  FSE_CTable *prevCTable;
  U32 *workspace_01;
  void *pvVar4;
  U32 *memPtr;
  size_t sVar5;
  size_t mostFrequent_00;
  BYTE *pBVar6;
  size_t sVar7;
  BYTE *pBVar8;
  long in_RDX;
  FSE_CTable *nextCTable;
  long in_RSI;
  long *in_RDI;
  size_t in_R8;
  long in_R9;
  FSE_CTable *pFVar9;
  FSE_CTable *in_stack_00000008;
  undefined4 in_stack_00000010;
  size_t bitstreamSize;
  size_t countSize_2;
  size_t mostFrequent_2;
  U32 max_2;
  size_t countSize_1;
  ZSTD_defaultPolicy_e defaultPolicy;
  size_t mostFrequent_1;
  U32 max_1;
  size_t countSize;
  size_t mostFrequent;
  U32 max;
  size_t cSize;
  size_t litSize;
  BYTE *literals;
  BYTE *seqHead;
  size_t nbSeq;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  BYTE *mlCodeTable;
  BYTE *llCodeTable;
  BYTE *ofCodeTable;
  seqDef *sequences;
  U32 MLtype;
  U32 Offtype;
  U32 LLtype;
  FSE_CTable *CTable_MatchLength;
  FSE_CTable *CTable_OffsetBits;
  FSE_CTable *CTable_LitLength;
  U32 count [53];
  int longOffsets;
  uint *puVar10;
  void *source;
  undefined8 in_stack_fffffffffffffda0;
  uint *maxSymbolValuePtr;
  S16 *pSVar11;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  BYTE *mlCodeTable_00;
  void *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe10;
  size_t in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  int bmi2_00;
  undefined8 in_stack_fffffffffffffe28;
  ZSTD_entropyCTables_t *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 uVar13;
  U32 *count_00;
  uint *puVar14;
  size_t sVar15;
  U32 max_00;
  BYTE *codeTable;
  S16 *defaultNorm;
  U32 in_stack_fffffffffffffea0;
  U32 in_stack_fffffffffffffea8;
  size_t in_stack_fffffffffffffec8;
  BYTE *local_28;
  
  uVar12 = (undefined4)((ulong)in_stack_fffffffffffffda0 >> 0x20);
  MEM_32bits();
  workspace_00 = (void *)(in_RDX + 0xcb0);
  prevCTableSize = in_RDX + 0x400;
  prevCTable = (FSE_CTable *)(in_RDX + 0x704);
  defaultNorm = (S16 *)*in_RDI;
  sVar7 = in_RDI[6];
  pBVar6 = (BYTE *)in_RDI[4];
  max_00 = (U32)in_RDI[5];
  workspace_01 = (U32 *)(in_R8 + in_R9);
  pvVar4 = (void *)(in_RDI[1] - *in_RDI >> 3);
  puVar10 = (uint *)in_RDI[2];
  memPtr = (U32 *)(in_RDI[3] - (long)puVar10);
  maxSymbolValuePtr = (uint *)CONCAT44(uVar12,in_stack_00000010);
  pFVar9 = in_stack_00000008;
  count_00 = memPtr;
  puVar14 = puVar10;
  sVar15 = in_R8;
  local_28 = (BYTE *)ZSTD_compressLiterals
                               ((ZSTD_entropyCTables_t *)
                                CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                in_stack_fffffffffffffe30,
                                (ZSTD_strategy)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                                (int)in_stack_fffffffffffffe28,
                                (void *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20
                                                ),in_stack_fffffffffffffe18,pvVar4,in_R8,
                                workspace_01,(int)in_R8);
  uVar1 = ZSTD_isError(0x1fb6da);
  if (uVar1 == 0) {
    local_28 = local_28 + in_R8;
    if ((long)workspace_01 - (long)local_28 < 4) {
      local_28 = (BYTE *)0xffffffffffffffba;
    }
    else {
      if (pvVar4 < (void *)0x7f) {
        nextCTable = (FSE_CTable *)(local_28 + 1);
        *local_28 = (BYTE)pvVar4;
      }
      else if (pvVar4 < (void *)0x7f00) {
        *local_28 = (char)((ulong)pvVar4 >> 8) + 0x80;
        local_28[1] = (BYTE)pvVar4;
        nextCTable = (FSE_CTable *)(local_28 + 2);
      }
      else {
        *local_28 = 0xff;
        MEM_writeLE16(memPtr,(U16)((ulong)puVar10 >> 0x30));
        nextCTable = (FSE_CTable *)(local_28 + 3);
      }
      if (pvVar4 == (void *)0x0) {
        memcpy((void *)(in_RDX + 0xcb0),(void *)(in_RSI + 0xcb0),0x524);
        *(undefined4 *)(in_RDX + 0x11e0) = *(undefined4 *)(in_RSI + 0x11e0);
        memcpy((void *)(in_RDX + 0x400),(void *)(in_RSI + 0x400),0x304);
        *(undefined4 *)(in_RDX + 0x11d8) = *(undefined4 *)(in_RSI + 0x11d8);
        memcpy((void *)(in_RDX + 0x704),(void *)(in_RSI + 0x704),0x5ac);
        *(undefined4 *)(in_RDX + 0x11dc) = *(undefined4 *)(in_RSI + 0x11dc);
        local_28 = (BYTE *)((long)nextCTable - sVar15);
      }
      else {
        pBVar8 = (BYTE *)((long)nextCTable + 1);
        ZSTD_seqToCodes((seqStore_t *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0))
        ;
        uVar13 = 0x23;
        sVar5 = FSE_countFast_wksp((uint *)CONCAT44(in_stack_fffffffffffffdac,
                                                    in_stack_fffffffffffffda8),maxSymbolValuePtr,
                                   pFVar9,(size_t)memPtr,puVar10);
        uVar12 = (undefined4)((ulong)puVar10 >> 0x20);
        *(undefined4 *)(in_RDX + 0x11e0) = *(undefined4 *)(in_RSI + 0x11e0);
        sVar2 = ZSTD_selectEncodingType
                          ((FSE_repeat *)(in_RDX + 0x11e0),sVar5,(size_t)pvVar4,6,
                           ZSTD_defaultAllowed);
        puVar10 = (uint *)CONCAT44(uVar12,uVar13);
        pSVar11 = LL_defaultNorm;
        uVar12 = 6;
        source = pvVar4;
        codeTable = pBVar6;
        local_28 = (BYTE *)ZSTD_buildCTable(pBVar8,(size_t)pvVar4,nextCTable,
                                            (U32)((ulong)puVar14 >> 0x20),
                                            (symbolEncodingType_e)puVar14,count_00,max_00,pBVar6,
                                            sVar7,defaultNorm,in_stack_fffffffffffffea0,
                                            in_stack_fffffffffffffea8,prevCTable,prevCTableSize,
                                            workspace_00,in_stack_fffffffffffffec8);
        uVar1 = ZSTD_isError(0x1fba81);
        if (uVar1 == 0) {
          pBVar8 = local_28 + (long)pBVar8;
          uVar1 = 0x1f;
          mostFrequent_00 =
               FSE_countFast_wksp((uint *)CONCAT44(in_stack_fffffffffffffdac,uVar12),(uint *)pSVar11
                                  ,pvVar4,(size_t)pBVar6,puVar10);
          bmi2_00 = (int)local_28;
          uVar12 = (undefined4)((ulong)puVar10 >> 0x20);
          isDefaultAllowed = (ZSTD_defaultPolicy_e)(uVar1 < 0x1d);
          *(undefined4 *)(in_RDX + 0x11d8) = *(undefined4 *)(in_RSI + 0x11d8);
          defaultMax = ZSTD_selectEncodingType
                                 ((FSE_repeat *)(in_RDX + 0x11d8),mostFrequent_00,(size_t)source,5,
                                  isDefaultAllowed);
          puVar10 = (uint *)CONCAT44(uVar12,uVar1);
          pSVar11 = OF_defaultNorm;
          uVar12 = 5;
          pvVar4 = source;
          sVar5 = sVar7;
          pBVar6 = (BYTE *)ZSTD_buildCTable(pBVar8,(size_t)source,nextCTable,
                                            (U32)((ulong)puVar14 >> 0x20),
                                            (symbolEncodingType_e)puVar14,count_00,max_00,codeTable,
                                            sVar7,defaultNorm,in_stack_fffffffffffffea0,defaultMax,
                                            prevCTable,prevCTableSize,workspace_00,
                                            in_stack_fffffffffffffec8);
          uVar1 = ZSTD_isError(0x1fbc27);
          local_28 = pBVar6;
          if (uVar1 == 0) {
            pBVar8 = pBVar6 + (long)pBVar8;
            uVar13 = 0x34;
            sVar7 = FSE_countFast_wksp((uint *)CONCAT44(in_stack_fffffffffffffdac,uVar12),
                                       (uint *)pSVar11,source,sVar7,puVar10);
            *(undefined4 *)(in_RDX + 0x11dc) = *(undefined4 *)(in_RSI + 0x11dc);
            sVar3 = ZSTD_selectEncodingType
                              ((FSE_repeat *)(in_RDX + 0x11dc),sVar7,(size_t)pvVar4,6,
                               ZSTD_defaultAllowed);
            pFVar9 = (FSE_CTable *)(in_RSI + 0x704);
            mlCodeTable_00 = (BYTE *)0x5ac;
            sVar7 = 0x1800;
            local_28 = (BYTE *)ZSTD_buildCTable(pBVar8,(size_t)pvVar4,nextCTable,
                                                (U32)((ulong)puVar14 >> 0x20),
                                                (symbolEncodingType_e)puVar14,count_00,max_00,
                                                codeTable,sVar5,defaultNorm,
                                                in_stack_fffffffffffffea0,defaultMax,prevCTable,
                                                prevCTableSize,workspace_00,
                                                in_stack_fffffffffffffec8);
            uVar1 = ZSTD_isError(0x1fbd9b);
            if (uVar1 == 0) {
              pBVar8 = local_28 + (long)pBVar8;
              *(char *)nextCTable =
                   (char)(sVar2 << 6) + (char)(defaultMax << 4) + (char)(sVar3 << 2);
              local_28 = (BYTE *)ZSTD_encodeSequences
                                           (in_stack_fffffffffffffdd8,sVar7,in_stack_00000008,
                                            mlCodeTable_00,pFVar9,
                                            (BYTE *)CONCAT44(in_stack_fffffffffffffdb4,
                                                             in_stack_00000010),
                                            (FSE_CTable *)CONCAT44(uVar13,in_stack_fffffffffffffe00)
                                            ,pBVar6,(seqDef *)
                                                    CONCAT44(isDefaultAllowed,
                                                             in_stack_fffffffffffffe10),
                                            mostFrequent_00,in_stack_fffffffffffffe20,bmi2_00);
              uVar1 = ZSTD_isError(0x1fbe8f);
              if (uVar1 == 0) {
                local_28 = local_28 + (long)pBVar8 + -sVar15;
              }
            }
          }
        }
      }
    }
  }
  return (size_t)local_28;
}

Assistant:

MEM_STATIC size_t ZSTD_compressSequences_internal(seqStore_t* seqStorePtr,
                              ZSTD_entropyCTables_t const* prevEntropy,
                              ZSTD_entropyCTables_t* nextEntropy,
                              ZSTD_CCtx_params const* cctxParams,
                              void* dst, size_t dstCapacity, U32* workspace,
                              const int bmi2)
{
    const int longOffsets = cctxParams->cParams.windowLog > STREAM_ACCUMULATOR_MIN;
    U32 count[MaxSeq+1];
    FSE_CTable* CTable_LitLength = nextEntropy->litlengthCTable;
    FSE_CTable* CTable_OffsetBits = nextEntropy->offcodeCTable;
    FSE_CTable* CTable_MatchLength = nextEntropy->matchlengthCTable;
    U32 LLtype, Offtype, MLtype;   /* compressed, raw or rle */
    const seqDef* const sequences = seqStorePtr->sequencesStart;
    const BYTE* const ofCodeTable = seqStorePtr->ofCode;
    const BYTE* const llCodeTable = seqStorePtr->llCode;
    const BYTE* const mlCodeTable = seqStorePtr->mlCode;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstCapacity;
    BYTE* op = ostart;
    size_t const nbSeq = seqStorePtr->sequences - seqStorePtr->sequencesStart;
    BYTE* seqHead;

    ZSTD_STATIC_ASSERT(HUF_WORKSPACE_SIZE >= (1<<MAX(MLFSELog,LLFSELog)));

    /* Compress literals */
    {   const BYTE* const literals = seqStorePtr->litStart;
        size_t const litSize = seqStorePtr->lit - literals;
        size_t const cSize = ZSTD_compressLiterals(
                                    prevEntropy, nextEntropy,
                                    cctxParams->cParams.strategy, cctxParams->disableLiteralCompression,
                                    op, dstCapacity,
                                    literals, litSize,
                                    workspace, bmi2);
        if (ZSTD_isError(cSize))
          return cSize;
        assert(cSize <= dstCapacity);
        op += cSize;
    }

    /* Sequences Header */
    if ((oend-op) < 3 /*max nbSeq Size*/ + 1 /*seqHead*/) return ERROR(dstSize_tooSmall);
    if (nbSeq < 0x7F)
        *op++ = (BYTE)nbSeq;
    else if (nbSeq < LONGNBSEQ)
        op[0] = (BYTE)((nbSeq>>8) + 0x80), op[1] = (BYTE)nbSeq, op+=2;
    else
        op[0]=0xFF, MEM_writeLE16(op+1, (U16)(nbSeq - LONGNBSEQ)), op+=3;
    if (nbSeq==0) {
      memcpy(nextEntropy->litlengthCTable, prevEntropy->litlengthCTable, sizeof(prevEntropy->litlengthCTable));
      nextEntropy->litlength_repeatMode = prevEntropy->litlength_repeatMode;
      memcpy(nextEntropy->offcodeCTable, prevEntropy->offcodeCTable, sizeof(prevEntropy->offcodeCTable));
      nextEntropy->offcode_repeatMode = prevEntropy->offcode_repeatMode;
      memcpy(nextEntropy->matchlengthCTable, prevEntropy->matchlengthCTable, sizeof(prevEntropy->matchlengthCTable));
      nextEntropy->matchlength_repeatMode = prevEntropy->matchlength_repeatMode;
      return op - ostart;
    }

    /* seqHead : flags for FSE encoding type */
    seqHead = op++;

    /* convert length/distances into codes */
    ZSTD_seqToCodes(seqStorePtr);
    /* build CTable for Literal Lengths */
    {   U32 max = MaxLL;
        size_t const mostFrequent = FSE_countFast_wksp(count, &max, llCodeTable, nbSeq, workspace);
        DEBUGLOG(5, "Building LL table");
        nextEntropy->litlength_repeatMode = prevEntropy->litlength_repeatMode;
        LLtype = ZSTD_selectEncodingType(&nextEntropy->litlength_repeatMode, mostFrequent, nbSeq, LL_defaultNormLog, ZSTD_defaultAllowed);
        {   size_t const countSize = ZSTD_buildCTable(op, oend - op, CTable_LitLength, LLFSELog, (symbolEncodingType_e)LLtype,
                    count, max, llCodeTable, nbSeq, LL_defaultNorm, LL_defaultNormLog, MaxLL,
                    prevEntropy->litlengthCTable, sizeof(prevEntropy->litlengthCTable),
                    workspace, HUF_WORKSPACE_SIZE);
            if (ZSTD_isError(countSize)) return countSize;
            op += countSize;
    }   }
    /* build CTable for Offsets */
    {   U32 max = MaxOff;
        size_t const mostFrequent = FSE_countFast_wksp(count, &max, ofCodeTable, nbSeq, workspace);
        /* We can only use the basic table if max <= DefaultMaxOff, otherwise the offsets are too large */
        ZSTD_defaultPolicy_e const defaultPolicy = (max <= DefaultMaxOff) ? ZSTD_defaultAllowed : ZSTD_defaultDisallowed;
        DEBUGLOG(5, "Building OF table");
        nextEntropy->offcode_repeatMode = prevEntropy->offcode_repeatMode;
        Offtype = ZSTD_selectEncodingType(&nextEntropy->offcode_repeatMode, mostFrequent, nbSeq, OF_defaultNormLog, defaultPolicy);
        {   size_t const countSize = ZSTD_buildCTable(op, oend - op, CTable_OffsetBits, OffFSELog, (symbolEncodingType_e)Offtype,
                    count, max, ofCodeTable, nbSeq, OF_defaultNorm, OF_defaultNormLog, DefaultMaxOff,
                    prevEntropy->offcodeCTable, sizeof(prevEntropy->offcodeCTable),
                    workspace, HUF_WORKSPACE_SIZE);
            if (ZSTD_isError(countSize)) return countSize;
            op += countSize;
    }   }
    /* build CTable for MatchLengths */
    {   U32 max = MaxML;
        size_t const mostFrequent = FSE_countFast_wksp(count, &max, mlCodeTable, nbSeq, workspace);
        DEBUGLOG(5, "Building ML table");
        nextEntropy->matchlength_repeatMode = prevEntropy->matchlength_repeatMode;
        MLtype = ZSTD_selectEncodingType(&nextEntropy->matchlength_repeatMode, mostFrequent, nbSeq, ML_defaultNormLog, ZSTD_defaultAllowed);
        {   size_t const countSize = ZSTD_buildCTable(op, oend - op, CTable_MatchLength, MLFSELog, (symbolEncodingType_e)MLtype,
                    count, max, mlCodeTable, nbSeq, ML_defaultNorm, ML_defaultNormLog, MaxML,
                    prevEntropy->matchlengthCTable, sizeof(prevEntropy->matchlengthCTable),
                    workspace, HUF_WORKSPACE_SIZE);
            if (ZSTD_isError(countSize)) return countSize;
            op += countSize;
    }   }

    *seqHead = (BYTE)((LLtype<<6) + (Offtype<<4) + (MLtype<<2));

    {   size_t const bitstreamSize = ZSTD_encodeSequences(
                                        op, oend - op,
                                        CTable_MatchLength, mlCodeTable,
                                        CTable_OffsetBits, ofCodeTable,
                                        CTable_LitLength, llCodeTable,
                                        sequences, nbSeq,
                                        longOffsets, bmi2);
        if (ZSTD_isError(bitstreamSize)) return bitstreamSize;
        op += bitstreamSize;
    }

    return op - ostart;
}